

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_copyall(Terminal *term,int *clipboards,wchar_t n_clipboards)

{
  tree234 *screen_00;
  pos bottom_00;
  pos top_00;
  wchar_t wVar1;
  wchar_t wVar2;
  tree234 *screen;
  pos bottom;
  pos top;
  wchar_t n_clipboards_local;
  int *clipboards_local;
  Terminal *term_local;
  
  screen_00 = term->screen;
  wVar1 = sblines(term);
  wVar2 = find_last_nonempty_line(term,screen_00);
  top_00.x = L'\0';
  top_00.y = -wVar1;
  bottom_00.x = term->cols;
  bottom_00.y = wVar2;
  clipme(term,top_00,bottom_00,false,true,clipboards,n_clipboards);
  return;
}

Assistant:

void term_copyall(Terminal *term, const int *clipboards, int n_clipboards)
{
    pos top;
    pos bottom;
    tree234 *screen = term->screen;
    top.y = -sblines(term);
    top.x = 0;
    bottom.y = find_last_nonempty_line(term, screen);
    bottom.x = term->cols;
    clipme(term, top, bottom, false, true, clipboards, n_clipboards);
}